

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O2

void CTcMain::S_v_log_error
               (CTcTokFileDesc *linedesc,long linenum,int *err_counter,int *warn_counter,
               int *first_error,int *first_warning,unsigned_long options,int *suppress_list,
               size_t suppress_cnt,tc_severity_t severity,int err,__va_list_tag *args)

{
  char *fmt;
  char local_818 [2048];
  
  fmt = log_msg_internal_1(linedesc,linenum,err_counter,warn_counter,first_error,first_warning,
                           options,suppress_list,suppress_cnt,severity,err);
  if (fmt != (char *)0x0) {
    t3vsprintf(local_818,0x800,fmt,args);
    format_message(local_818,options);
    log_msg_internal_2(options,severity);
  }
  return;
}

Assistant:

void CTcMain::S_v_log_error(CTcTokFileDesc *linedesc, long linenum,
                            int *err_counter, int *warn_counter,
                            int *first_error, int *first_warning,
                            unsigned long options,
                            const int *suppress_list, size_t suppress_cnt,
                            tc_severity_t severity, int err, va_list args)
{
    const char *msg;
    char msgbuf[2048];

    /* show the prefix */
    msg = log_msg_internal_1(linedesc, linenum, err_counter, warn_counter,
                             first_error, first_warning, options,
                             suppress_list, suppress_cnt, severity, err);

    /* if the message is suppressed, we're done */
    if (msg == 0)
        return;

    /* format the message using the va_list argument */
    t3vsprintf(msgbuf, sizeof(msgbuf), msg, args);

    /* display it */
    format_message(msgbuf, options);

    /* show the suffix */
    log_msg_internal_2(options, severity);
}